

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

void ssl_free_buffered_record(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  uchar *__ptr;
  
  pmVar1 = ssl->handshake;
  if ((pmVar1 != (mbedtls_ssl_handshake_params *)0x0) &&
     (__ptr = (pmVar1->buffering).future_record.data, __ptr != (uchar *)0x0)) {
    (pmVar1->buffering).total_bytes_buffered =
         (pmVar1->buffering).total_bytes_buffered - (pmVar1->buffering).future_record.len;
    free(__ptr);
    (pmVar1->buffering).future_record.data = (uchar *)0x0;
  }
  return;
}

Assistant:

static void ssl_free_buffered_record(mbedtls_ssl_context *ssl)
{
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    if (hs == NULL) {
        return;
    }

    if (hs->buffering.future_record.data != NULL) {
        hs->buffering.total_bytes_buffered -=
            hs->buffering.future_record.len;

        mbedtls_free(hs->buffering.future_record.data);
        hs->buffering.future_record.data = NULL;
    }
}